

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistoryTracker.cpp
# Opt level: O0

void __thiscall solitaire::archivers::HistoryTracker::undo(HistoryTracker *this)

{
  bool bVar1;
  runtime_error *this_00;
  reference this_01;
  pointer pSVar2;
  HistoryTracker *this_local;
  
  bVar1 = std::
          vector<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>,_std::allocator<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>_>
          ::empty(&this->history);
  if (!bVar1) {
    this_01 = std::
              vector<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>,_std::allocator<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>_>
              ::back(&this->history);
    pSVar2 = std::
             unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             ::operator->(this_01);
    (*pSVar2->_vptr_Snapshot[2])();
    std::
    vector<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>,_std::allocator<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>_>
    ::pop_back(&this->history);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Cannot undo operation when history is empty.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void HistoryTracker::undo() {
    if (history.empty())
        throw std::runtime_error {"Cannot undo operation when history is empty."};

    history.back()->restore();
    history.pop_back();
}